

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aac.cpp
# Opt level: O1

bool __thiscall AACCodec::decodeFrame(AACCodec *this,uint8_t *buffer,uint8_t *end)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  BitStreamReader bits;
  BitStreamReader local_30;
  
  local_30.super_BitStream.m_totalBits = 0;
  local_30.super_BitStream.m_buffer = (uint *)0x0;
  local_30.super_BitStream.m_initBuffer = (uint *)0x0;
  local_30.m_curVal = 0;
  local_30.m_bitLeft = 0;
  BitStream::setBuffer(&local_30.super_BitStream,buffer,end);
  local_30._24_8_ = local_30._24_8_ & 0xffffffff;
  local_30.m_curVal = BitStreamReader::getCurVal(&local_30,local_30.super_BitStream.m_buffer);
  local_30.m_bitLeft = 0x20;
  uVar3 = BitStreamReader::getBits(&local_30,0xc);
  if (uVar3 == 0xfff) {
    bVar2 = BitStreamReader::getBit(&local_30);
    this->m_id = (uint)bVar2;
    uVar3 = BitStreamReader::getBits(&local_30,2);
    this->m_layer = uVar3 & 0xff;
    BitStreamReader::skipBit(&local_30);
    uVar3 = BitStreamReader::getBits(&local_30,2);
    this->m_profile = (uint8_t)uVar3;
    uVar3 = BitStreamReader::getBits(&local_30,4);
    this->m_sample_rates_index = (uint8_t)uVar3;
    if (2 < (ulong)(uVar3 & 0xff) - 0xd) {
      BitStreamReader::skipBit(&local_30);
      uVar3 = BitStreamReader::getBits(&local_30,3);
      this->m_channels_index = (uint8_t)uVar3;
      if ((uint8_t)uVar3 != '\0') {
        BitStreamReader::skipBit(&local_30);
        BitStreamReader::skipBit(&local_30);
        BitStreamReader::skipBit(&local_30);
        BitStreamReader::skipBit(&local_30);
        uVar3 = BitStreamReader::getBits(&local_30,0xd);
        BitStreamReader::skipBits(&local_30,0xb);
        uVar4 = BitStreamReader::getBits(&local_30,2);
        this->m_rdb = (uint8_t)uVar4;
        this->m_channels = ""[this->m_channels_index];
        iVar1 = aac_sample_rates[this->m_sample_rates_index];
        this->m_sample_rate = iVar1;
        iVar5 = (uVar4 & 0xff) * 0x400 + 0x400;
        this->m_samples = iVar5;
        this->m_bit_rate = (int)((uVar3 & 0xffff) * 8 * iVar1) / iVar5;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool AACCodec::decodeFrame(uint8_t* buffer, const uint8_t* end)
{
    BitStreamReader bits{};
    try
    {
        bits.setBuffer(buffer, end);
        if (bits.getBits(12) != 0xfff)  // sync bytes
            return false;

        m_id = bits.getBit();               /* 0: MPEG-4, 1: MPEG-2*/
        m_layer = bits.getBits<uint8_t>(2); /* layer */
        bits.skipBit();                     /* protection_absent */
        // -- 16 bit
        m_profile = bits.getBits<uint8_t>(2);            /* profile_objecttype */
        m_sample_rates_index = bits.getBits<uint8_t>(4); /* sample_frequency_index */
        if (!aac_sample_rates[m_sample_rates_index])
            return false;
        bits.skipBit();                              /* private_bit */
        m_channels_index = bits.getBits<uint8_t>(3); /* channel_configuration */
        if (!aac_channels[m_channels_index])
            return false;
        bits.skipBit(); /* original/copy */
        bits.skipBit(); /* home */

        /* adts_variable_header */
        bits.skipBit();                                    /* copyright_identification_bit */
        bits.skipBit();                                    /* copyright_identification_start */
        const auto frameSize = bits.getBits<uint16_t>(13); /* aac_frame_length */
        bits.skipBits(11);                                 /* adts_buffer_fullness */
        m_rdb = bits.getBits<uint8_t>(2);                  /* number_of_raw_data_blocks_in_frame */

        m_channels = aac_channels[m_channels_index];
        m_sample_rate = aac_sample_rates[m_sample_rates_index];
        m_samples = (m_rdb + 1) * 1024;
        m_bit_rate = frameSize * 8 * m_sample_rate / m_samples;
        return true;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return false;
    }
}